

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

void __thiscall asmjit::v1_14::ConstPool::fill(ConstPool *this,void *dst)

{
  char cVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  char cVar10;
  char cVar11;
  uint uVar12;
  ulong *puVar13;
  byte *pbVar14;
  size_t *extraout_RDX;
  byte *pbVar15;
  uint uVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong *puVar19;
  uint uVar20;
  ulong *__src;
  uint *puVar21;
  undefined8 *__dest;
  ulong uVar22;
  byte bVar23;
  ulong uVar24;
  uint *puVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  uint *puVar30;
  size_t __n;
  ulong *puVar31;
  bool bVar32;
  bool bVar33;
  uint in_XCR0;
  uint uStack_368;
  undefined8 uStack_358;
  ulong uStack_350;
  ulong uStack_348;
  ulong uStack_340;
  undefined4 uStack_338;
  int iStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined8 uStack_328;
  uint auStack_320 [16];
  ulong uStack_2e0;
  ulong uStack_2d8;
  ulong uStack_2d0;
  undefined8 uStack_2c8;
  void *pvStack_2c0;
  long lStack_2b8;
  long lStack_2b0;
  ulong *puStack_2a8;
  size_t sStack_2a0;
  code *pcStack_298;
  bool bStack_289;
  undefined8 *puStack_288;
  ulong *puStack_280;
  size_t *psStack_278;
  ulong uStack_270;
  ulong *puStack_268;
  void *pvStack_258;
  long lStack_250;
  long lStack_248;
  undefined1 *puStack_240;
  size_t sStack_238;
  ulong *puStack_230;
  long local_228 [63];
  
  lVar27 = 0;
  __src = (ulong *)0x0;
  puStack_230 = (ulong *)0x11c113;
  __dest = (undefined8 *)dst;
  memset(dst,0,this->_size);
  puVar19 = (ulong *)&this->field_0x8;
  __n = 1;
  do {
    if (*(ulong **)((long)puVar19 + lVar27 * 0x18) != (ulong *)0x0) {
      lVar28 = 0;
      puVar17 = *(ulong **)((long)puVar19 + lVar27 * 0x18);
      do {
        puVar13 = (ulong *)(*puVar17 & 0xfffffffffffffffe);
        if (puVar13 == (ulong *)0x0) {
          while( true ) {
            if ((puVar17[2] & 1) == 0) {
              __dest = (undefined8 *)((ulong)*(uint *)((long)puVar17 + 0x14) + (long)dst);
              __src = puVar17 + 3;
              puStack_230 = (ulong *)0x11c16a;
              memcpy(__dest,__src,__n);
            }
            puVar13 = (ulong *)puVar17[1];
            if (puVar13 != (ulong *)0x0) {
              iVar26 = 0;
              goto LAB_0011c187;
            }
            bVar32 = lVar28 == 0;
            lVar28 = lVar28 + -1;
            if (bVar32) break;
            puVar17 = (ulong *)local_228[lVar28];
          }
          iVar26 = 1;
          lVar28 = 0;
          puVar13 = (ulong *)0x0;
        }
        else {
          if (lVar28 == 0x3e) {
            puStack_230 = (ulong *)0x11c1b3;
            fill();
            puStack_230 = puVar17;
            sStack_238 = __n;
            puStack_240 = (undefined1 *)puVar19;
            lStack_248 = lVar28;
            lStack_250 = lVar27;
            pvStack_258 = dst;
            psStack_278 = extraout_RDX;
            if (*__src < 2) {
              puVar19 = __src;
              if (__src[1] != 0) goto LAB_0011c3d6;
              if (*__src == 0) {
                puVar19 = (ulong *)*__dest;
                if (puVar19 == (ulong *)0x0) {
                  *__dest = __src;
                }
                else {
                  puStack_288 = __dest;
                  puVar17 = &uStack_270;
                  uStack_270 = 0;
                  puStack_268 = puVar19;
                  *__src = 1;
                  puStack_280 = __src + 3;
                  uVar8 = 0;
                  uVar22 = 0;
                  puVar13 = (ulong *)0x0;
                  puVar31 = (ulong *)0x0;
                  while( true ) {
                    uVar29 = uVar8;
                    if (puVar19 == (ulong *)0x0) {
                      puVar31[uVar29] = (ulong)((uint)puVar31[uVar29] & 1) | (ulong)__src;
                      puVar18 = __src;
                    }
                    else {
                      pbVar14 = (byte *)(*puVar19 & 0xfffffffffffffffe);
                      puVar18 = puVar19;
                      if ((((pbVar14 != (byte *)0x0) && ((*pbVar14 & 1) != 0)) &&
                          ((byte *)puVar19[1] != (byte *)0x0)) && ((*(byte *)puVar19[1] & 1) != 0))
                      {
                        *puVar19 = *puVar19 | 1;
                        *pbVar14 = *pbVar14 & 0xfe;
                        *(ulong *)puVar19[1] = *(ulong *)puVar19[1] & 0xfffffffffffffffe;
                      }
                    }
                    if (((puVar31 != (ulong *)0x0) && ((*puVar18 & 1) != 0)) &&
                       ((*puVar31 & 1) != 0)) {
                      bVar33 = puVar13 == (ulong *)puVar17[1];
                      uVar8 = (ulong)(uVar22 == 0);
                      bVar32 = uVar22 != 0;
                      pbVar14 = (byte *)(puVar13[bVar32] & 0xfffffffffffffffe);
                      if (puVar18 == (ulong *)(puVar31[uVar22] & 0xfffffffffffffffe)) {
                        puVar19 = (ulong *)(pbVar14 + uVar8 * 8);
                        uVar22 = (ulong)((uint)puVar13[bVar32] & 1) | *puVar19 & 0xfffffffffffffffe;
                      }
                      else {
                        pbVar15 = (byte *)(*(ulong *)(pbVar14 + (ulong)(uVar22 == 0) * 8) &
                                          0xfffffffffffffffe);
                        bStack_289 = bVar33;
                        uVar24 = (ulong)((uint)bVar32 * 8);
                        *(ulong *)(pbVar14 + (ulong)(uVar22 == 0) * 8) =
                             (ulong)((uint)*(ulong *)(pbVar14 + (ulong)(uVar22 == 0) * 8) & 1) |
                             *(ulong *)(pbVar15 + uVar24) & 0xfffffffffffffffe;
                        *(ulong *)(pbVar15 + uVar24) =
                             (ulong)((uint)*(undefined8 *)(pbVar15 + uVar24) & 1) | (ulong)pbVar14;
                        *pbVar14 = *pbVar14 | 1;
                        *pbVar15 = *pbVar15 & 0xfe;
                        uVar22 = (ulong)((uint)*(undefined8 *)((long)puVar13 + uVar24) & 1);
                        *(byte **)((long)puVar13 + uVar24) = pbVar15 + uVar22;
                        puVar19 = (ulong *)(pbVar15 + uVar8 * 8);
                        uVar22 = *puVar19 & 0xfffffffffffffffe | uVar22;
                        pbVar14 = pbVar15;
                      }
                      puVar13[bVar32] = uVar22;
                      *puVar19 = (ulong)((uint)*puVar19 & 1) | (ulong)puVar13;
                      *(byte *)puVar13 = (byte)*puVar13 | 1;
                      *pbVar14 = *pbVar14 & 0xfe;
                      puVar17[bVar33] = (ulong)((uint)puVar17[bVar33] & 1) | (ulong)pbVar14;
                    }
                    if (puVar18 == __src) break;
                    pcStack_298 = (code *)0x11c38c;
                    uVar6 = memcmp(puVar18 + 3,puStack_280,*psStack_278);
                    if (puVar13 != (ulong *)0x0) {
                      puVar17 = puVar13;
                    }
                    puVar19 = (ulong *)(puVar18[uVar6 >> 0x1f] & 0xfffffffffffffffe);
                    uVar8 = (ulong)(uVar6 >> 0x1f);
                    uVar22 = uVar29;
                    puVar13 = puVar31;
                    puVar31 = puVar18;
                  }
                  *puStack_288 = puStack_268;
                  *(byte *)puStack_268 = (byte)*puStack_268 & 0xfe;
                }
                return;
              }
            }
            else {
              pcStack_298 = (code *)0x11c3d6;
              ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>();
LAB_0011c3d6:
              pcStack_298 = (code *)0x11c3db;
              ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>();
            }
            pcStack_298 = CpuInfo::host;
            ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>();
            pcStack_298 = (code *)puVar17;
            sStack_2a0 = __n;
            puStack_2a8 = puVar19;
            lStack_2b0 = lVar28;
            lStack_2b8 = lVar27;
            pvStack_2c0 = dst;
            if (CpuInfo::host()::cpuInfoGlobal == '\0') {
              CpuInfo::host();
            }
            if (CpuInfo::host::cpuInfoInitialized.super___atomic_base<unsigned_int>._M_i != 0) {
              return;
            }
            puVar25 = (uint *)((long)&uStack_328 + 4);
            uStack_2e0 = 0;
            uStack_2d0 = 0;
            uStack_2c8 = 0;
            uStack_350 = 0;
            uStack_348 = 0;
            uStack_338 = 0;
            uStack_32c = 0;
            auStack_320[0] = 0;
            auStack_320[1] = 0;
            auStack_320[2] = 0;
            auStack_320[3] = 0;
            auStack_320[4] = 0;
            auStack_320[5] = 0;
            auStack_320[6] = 0;
            auStack_320[7] = 0;
            auStack_320[8] = 0;
            auStack_320[9] = 0;
            auStack_320[10] = 0;
            auStack_320[0xb] = 0;
            auStack_320[0xc] = 0;
            auStack_320[0xd] = 0;
            auStack_320[0xe] = 0;
            uStack_358 = 0x10002;
            uStack_340 = 1;
            uStack_2d8 = 0x80;
            puVar30 = (uint *)cpuid_basic_info(0);
            uVar6 = *puVar30;
            uVar8 = 0;
            puVar21 = (uint *)0x14fbb0;
            goto LAB_0011c479;
          }
          local_228[lVar28] = (long)puVar17;
          lVar28 = lVar28 + 1;
          iVar26 = 3;
        }
LAB_0011c187:
        puVar17 = puVar13;
      } while ((iVar26 == 0) || (iVar26 == 3));
    }
    __n = __n * 2;
    lVar27 = lVar27 + 1;
    if (lVar27 == 7) {
      return;
    }
  } while( true );
  while( true ) {
    uVar8 = uVar8 + 1;
    puVar21 = puVar21 + 5;
    if (uVar8 == 4) break;
LAB_0011c479:
    if (((puVar21[-2] == puVar30[1]) && (puVar21[-1] == puVar30[2])) && (*puVar21 == puVar30[3]))
    goto LAB_0011c499;
  }
  uVar8 = 4;
LAB_0011c499:
  iStack_334 = (int)*(undefined8 *)
                     (&x86::
                       simplifyCpuVendor(asmjit::v1_14::CpuInfo&,unsigned_int,unsigned_int,unsigned_int)
                       ::table + (uVar8 & 0xffffffff) * 0x14);
  uStack_330 = (undefined4)
               ((ulong)*(undefined8 *)
                        (&x86::
                          simplifyCpuVendor(asmjit::v1_14::CpuInfo&,unsigned_int,unsigned_int,unsigned_int)
                          ::table + (uVar8 & 0xffffffff) * 0x14) >> 0x20);
  iVar26 = 0;
  uVar16 = 0;
  if (uVar6 != 0) {
    puVar30 = (uint *)cpuid_Version_info(1);
    uVar16 = *puVar30;
    uVar7 = puVar30[1];
    uVar3 = puVar30[2];
    uVar4 = puVar30[3];
    uVar12 = uVar16 >> 4 & 0xf;
    uVar20 = uVar16 >> 8 & 0xf;
    if ((uVar20 == 0xf) || (uVar20 == 6)) {
      uVar12 = uVar12 | uVar16 >> 0xc & 0xf0;
    }
    uVar5 = (uVar16 >> 0x14 & 0xff) + 0xf;
    if (uVar20 != 0xf) {
      uVar5 = uVar20;
    }
    uStack_358 = CONCAT44(uVar5,0x10002);
    uStack_350 = CONCAT44(uVar7,uVar12) & 0xffffffffff;
    uStack_348 = CONCAT44(uVar16 >> 0xc,uVar16) & 0x30000000f;
    uStack_340 = CONCAT44(uVar7 >> 5,uVar7 >> 0x10) & 0x7f8000000ff;
    uVar7 = uVar4 >> 0xd & 0x2000;
    uStack_2d0 = (ulong)(uVar7 | (uVar4 & 0x20) << 2);
    uVar22 = (ulong)(uVar4 >> 2 & 0x2000000);
    uVar16 = uVar3 >> 0x19 & 1;
    uVar8 = (ulong)(uVar3 >> 0x1a & 1);
    uStack_2d8 = uVar8 << 0x39 |
                 uVar8 << 0x3a |
                 (ulong)(uVar16 << 0xf) |
                 (ulong)uVar16 << 0x39 | (ulong)(uVar3 >> 0x18 & 1 | uVar3 >> 9 & 0x4000) |
                 (ulong)((uVar3 & 0x20) << 0x11) | (ulong)(uVar3 >> 4 & 1) << 0x28 |
                 (ulong)(uVar4 >> 0x1e & 1) << 0x26 | uVar22 |
                 (ulong)((uVar4 & 0x800000) << 6) |
                 (ulong)(uVar4 >> 4 & 0x40000) |
                 (ulong)(uVar4 >> 0x14 & 1) << 0x3d | (ulong)(uVar4 >> 0x13 & 1) << 0x3c |
                 (ulong)(uVar4 >> 9) << 0x3f | (ulong)(uVar4 >> 6 & 1) << 0x38 |
                 (ulong)((uVar4 & 8) << 0xd) |
                 (ulong)((uVar4 & 2) << 0x1a) | (ulong)(uVar4 & 1) << 0x3b | 0x80;
    uStack_2e0 = (ulong)(uVar3 >> 0x1b & 2) |
                 (ulong)(uVar3 >> 0x13 & 1) << 0x2d |
                 (ulong)(uVar3 >> 0xf & 1) << 0x31 | (ulong)(uVar3 >> 8 & 1) << 0x34 |
                 (ulong)(uVar3 & 1) << 0x3b | (ulong)(uVar4 >> 0x13 & 0x40) |
                 (ulong)(uVar4 >> 0xd & 1) << 0x33;
    uVar16 = 0;
    if ((uVar7 != 0) && (uVar16 = 0, uVar22 != 0)) {
      uVar16 = in_XCR0;
    }
    if (((~uVar16 & 6) == 0 & (byte)(uVar4 >> 0x1c)) == 1) {
      uStack_2e0 = (ulong)(uVar4 >> 0x1d & 1) << 0x38 | (ulong)(uVar4 >> 0xc & 1) << 0x39 |
                   uStack_2e0 | 0x4000;
    }
  }
  uVar8 = uStack_2e0;
  bVar23 = 0;
  if (6 < uVar6) {
    piVar2 = (int *)cpuid_Extended_Feature_Enumeration_info(7);
    iVar26 = *piVar2;
    uVar7 = piVar2[1];
    uVar3 = piVar2[2];
    uVar4 = piVar2[3];
    uVar29 = (ulong)(uVar7 >> 0xb & 1);
    uStack_2d0 = (ulong)(uVar3 >> 0xc & 0x10 | uVar3 & 0x20 | uVar4 >> 2 & 0x100 | uVar4 >> 3 & 0x40
                        ) | (uVar4 & 0x20) << 4 | uStack_2d0;
    uStack_2e0 = (ulong)(uVar3 >> 0x14 & 1) << 0x29 |
                 (ulong)(uVar3 >> 4 & 1) << 0x3d | (ulong)(uVar4 >> 0x1d & 1) << 0x36 |
                 (ulong)(uVar4 >> 0x19 & 1) << 0x2c |
                 (ulong)(uVar4 >> 7 & 1) << 0x2a |
                 (ulong)(uVar7 >> 0x18 & 1) << 0x2f | (ulong)(uVar7 >> 0x17 & 1) << 0x2e |
                 (ulong)(uVar7 >> 0xe & 0x20) |
                 (ulong)(uVar7 >> 9 & 1) << 0x37 | (ulong)(uVar7 >> 8 & 1) << 0x28 |
                 (ulong)(uVar7 >> 3 & 1) << 0x27 | (ulong)(uVar7 & 1) << 0x3c | uStack_2e0;
    uVar22 = (ulong)(uVar7 * 2 & 0x20);
    uStack_2d8 = (ulong)((uVar3 & 0x40000) << 10) |
                 (ulong)(uVar3 >> 0xe & 1) << 0x2c |
                 (ulong)(uVar4 >> 9 & 0x80000 | uVar4 >> 7 & 0x100000) |
                 (ulong)(uVar4 >> 0x16 & 1) << 0x24 | (ulong)(uVar4 >> 4 & 0x10) |
                 (ulong)((uVar4 & 0x10) << 0x16) |
                 (ulong)(uVar4 & 1) << 0x20 | (ulong)(uVar7 >> 0x1d & 1) << 0x30 |
                 (ulong)(uVar7 >> 0x14 & 1) << 0x35 |
                 (ulong)(uVar7 >> 0x12 & 1) << 0x27 | uVar29 << 0x2a |
                 (ulong)(uVar7 >> 7 & 1) << 0x37 | uVar22 | uStack_2d8;
    if (uVar29 != 0 || uVar22 != 0) {
      uStack_2d0 = uStack_2d0 | 8;
    }
    uStack_368 = (uint)uVar8;
    if (uStack_368 >> 0xe != 0 && (uVar7 & 0x20) != 0) {
      uStack_2e0 = uStack_2e0 | 0x8000;
    }
    if (((byte)(uVar7 >> 0x10) & 1 & (uVar16 & 0xe6) == 0xe6) == 1) {
      uStack_2e0 = uStack_2e0 |
                   (ulong)((uVar7 & 0x220000) << 5 | uVar7 * 2 & 0x8000000 | uVar7 >> 4 & 0x800000 |
                           uVar7 >> 7 & 0x200000 | uVar7 >> 10 & 0x100000 | uVar7 >> 1 & 0x40000000
                           | (uVar4 & 2) << 0x1b |
                           (uVar3 & 0x800000) << 2 |
                           (uVar3 & 8) << 0xd |
                           (uVar3 & 4) << 0xf |
                           (uVar4 & 0x1000) << 7 | (uVar4 & 0x800) << 0x14 | (uVar4 & 0x40) << 0x17
                          | 0x1000000) | (ulong)(uVar4 >> 0xe & 1) << 0x21 |
                   (ulong)(uVar3 >> 8 & 1) << 0x20;
    }
    bVar23 = (byte)(uVar7 >> 0xe) & 1;
    if ((uVar16 & 0x60000) == 0x60000) {
      uStack_2e0 = uStack_2e0 | (uVar3 >> 0xe & 0x900 | uVar3 >> 0xc & 0x1000);
    }
  }
  if (iVar26 != 0) {
    puVar30 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
    uVar7 = *puVar30;
    uVar3 = puVar30[2];
    uStack_2d0 = (ulong)(puVar30[1] * 2 & 4) | uVar7 >> 8 & 0x800 | uStack_2d0;
    uStack_2d8 = (ulong)((uVar3 & 0x4000) << 0x10) |
                 (ulong)(uVar7 >> 4 & 0x800000 | uVar7 >> 0x10 & 0x440) |
                 (ulong)(uVar7 >> 8 & 4) |
                 (ulong)(uVar7 >> 3 & 1) << 0x22 |
                 (ulong)(uVar7 >> 2 & 1) << 0x34 | (ulong)(uVar7 >> 1 & 1) << 0x33 |
                 (ulong)(uVar7 & 1) << 0x31 | uStack_2d8;
    uVar8 = (ulong)(uVar3 >> 8 & 0x2000) | (ulong)(uVar3 >> 0x12 & 1) << 0x2b |
            (ulong)(uVar7 >> 0xc & 1) << 0x3e | (ulong)(uVar7 >> 0xb) << 0x3f |
            (ulong)(uVar7 >> 7 & 1) << 0x32 | uStack_2e0;
    if ((short)uStack_2e0 < 0) {
      uVar8 = uVar8 | (ulong)(uVar3 >> 10 & 1) << 0x25 |
                      (ulong)(uVar3 >> 5 & 1) << 0x23 |
                      (ulong)(uVar3 >> 4 & 1) << 0x26 |
                      (ulong)(uVar7 >> 0x17 & 1) << 0x22 | (ulong)(uVar7 >> 4 & 1) << 0x24;
    }
    uStack_2e0 = uVar7 << 0xd & (uint)(uVar8 >> 6) & 0x3ffffff & 0x40000 | uVar8;
    if ((uVar16 & 0x60000) == 0x60000) {
      uStack_2e0 = uStack_2e0 | (uVar7 >> 0xb & 0x400) + (uVar3 & 0x100) * 2;
    }
  }
  if (0xc < uVar6) {
    puVar30 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    if (bVar23 == 1 && (~(uVar16 & *puVar30) & 0x18) == 0) {
      uStack_2d8 = uStack_2d8 | 0x200000;
    }
    puVar30 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    uStack_2d0 = (ulong)((*puVar30 & 10) << 0xd) | (*puVar30 & 1) << 0xf | uStack_2d0;
  }
  if (0xd < uVar6) {
    lVar27 = cpuid(0xe);
    uStack_2d8 = uStack_2d8 | (ulong)(*(uint *)(lVar27 + 4) >> 4 & 1) << 0x21;
  }
  uVar6 = 0x80000000;
  uVar16 = 0x80000000;
  puVar30 = puVar25;
  do {
    uVar8 = uStack_2e0;
    if (uVar16 == 0) {
      puVar21 = (uint *)cpuid_basic_info(0);
    }
    else if (uVar16 == 1) {
      puVar21 = (uint *)cpuid_Version_info(1);
    }
    else if (uVar16 == 2) {
      puVar21 = (uint *)cpuid_cache_tlb_info(2);
    }
    else if (uVar16 == 3) {
      puVar21 = (uint *)cpuid_serial_info(3);
    }
    else if (uVar16 == 4) {
      puVar21 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (uVar16 == 5) {
      puVar21 = (uint *)cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (uVar16 == 6) {
      puVar21 = (uint *)cpuid_Thermal_Power_Management_info(6);
    }
    else if (uVar16 == 7) {
      puVar21 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (uVar16 == 9) {
      puVar21 = (uint *)cpuid_Direct_Cache_Access_info(9);
    }
    else if (uVar16 == 10) {
      puVar21 = (uint *)cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (uVar16 == 0xb) {
      puVar21 = (uint *)cpuid_Extended_Topology_info(0xb);
    }
    else if (uVar16 == 0xd) {
      puVar21 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    }
    else if (uVar16 == 0xf) {
      puVar21 = (uint *)cpuid_Quality_of_Service_info(0xf);
    }
    else if (uVar16 == 0x80000002) {
      puVar21 = (uint *)cpuid_brand_part1_info(0x80000002);
    }
    else if (uVar16 == 0x80000003) {
      puVar21 = (uint *)cpuid_brand_part2_info(0x80000003);
    }
    else if (uVar16 == 0x80000004) {
      puVar21 = (uint *)cpuid_brand_part3_info(0x80000004);
    }
    else {
      puVar21 = (uint *)cpuid(uVar16);
    }
    uVar7 = *puVar21;
    uVar3 = puVar21[1];
    uVar4 = puVar21[2];
    uVar12 = puVar21[3];
    switch(uVar16) {
    case 0x80000000:
      uVar6 = uVar7;
      if (0x8000001e < uVar7) {
        uVar6 = 0x8000001f;
      }
      uVar16 = 0x80000000;
      break;
    case 0x80000001:
      uStack_2d0 = (ulong)(uVar12 >> 0x14 & 2) | uVar12 >> 2 & 1 | uStack_2d0;
      uVar16 = uVar4 >> 0x1e & 1;
      uStack_2e0 = (ulong)(uVar16 << 4) | uVar4 >> 0x12 & 4 | uStack_2e0;
      uStack_2d8 = (ulong)(uVar4 & 0x80000000 | uVar16 << 0xf) |
                   (ulong)(uVar4 * 4 & 0x80000000) |
                   (ulong)(uVar4 >> 0x1b & 1) << 0x29 |
                   (ulong)(uVar4 >> 7 & 0x8000 | uVar4 >> 0x14 & 2) |
                   (ulong)(uVar12 >> 0xc & 0x20000) |
                   (ulong)(uVar12 >> 4 & 0x800) |
                   (ulong)(uVar12 >> 0xc & 1) << 0x32 |
                   (ulong)((uVar12 & 0x100) << 0x17) |
                   (ulong)((uVar12 & 0x80) << 0x11) |
                   (ulong)(uVar12 >> 6 & 1) << 0x3e | (ulong)((uVar12 & 0x20) << 7) |
                   (uVar12 & 1) << 9 | uStack_2d8;
      if (((uint)uVar8 >> 0xe & 1) != 0) {
        uStack_2d0 = uStack_2d0 | uVar12 * 2 & 0x1000;
        uStack_2e0 = uStack_2e0 | (ulong)(uVar12 >> 0x10 & 1) << 0x3a;
      }
      uVar16 = 0x80000001;
      if (iStack_334 == 0x444d41) {
        uStack_2e0 = uStack_2e0 | (uVar12 & 0x10) << 3;
      }
      break;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
      *puVar30 = uVar7;
      puVar30[1] = uVar3;
      puVar30[2] = uVar12;
      puVar30[3] = uVar4;
      puVar30 = puVar30 + 4;
      if (uVar16 == 0x80000004) {
        uVar16 = 0x80000007;
      }
      break;
    case 0x80000005:
    case 0x80000006:
    case 0x80000007:
      break;
    case 0x80000008:
      uStack_2e0 = uStack_2e0 | (ulong)(uVar3 & 1) << 0x30;
      uStack_2d8 = uStack_2d8 | (ulong)((uVar3 & 0x100) << 5) | (ulong)(uVar3 & 1) << 0x25;
      uStack_2d0 = uStack_2d0 | uVar3 * 2 & 0x400;
      uVar16 = 0x8000001e;
      break;
    default:
      if (uVar16 == 0x8000001f) {
        uStack_2d8 = uStack_2d8 |
                     (ulong)(uVar7 >> 6 & 1) << 0x23 |
                     (ulong)(uVar7 >> 4 & 1) << 0x2f |
                     (ulong)(uVar7 >> 3 & 1) << 0x2e |
                     (ulong)(uVar7 >> 1 & 1) << 0x2d | (ulong)(uVar7 & 1) << 0x36;
        uVar16 = 0x8000001f;
      }
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 <= uVar6);
  pcVar9 = (char *)((long)&uStack_328 + 5);
  uStack_328._4_1_ = '\0';
  uStack_328 = 0;
  cVar11 = '\0';
  cVar10 = uStack_328._4_1_;
  do {
    if (cVar10 == ' ') {
      if ((((cVar11 != '@') && (cVar1 = *pcVar9, cVar1 != '\0')) && (cVar1 != ' ')) &&
         (cVar1 != '@')) goto LAB_0011d02f;
    }
    else {
      if (cVar10 == '\0') {
        *(undefined1 *)puVar25 = 0;
        lVar28 = sysconf(0x54);
        lVar27 = 1;
        if (1 < lVar28) {
          lVar27 = lVar28;
        }
        uStack_338 = (undefined4)lVar27;
        memcpy(CpuInfo::host()::cpuInfoGlobal,&uStack_358,0x98);
        LOCK();
        UNLOCK();
        CpuInfo::host::cpuInfoInitialized.super___atomic_base<unsigned_int>._M_i =
             (__atomic_base<unsigned_int>)1;
        return;
      }
LAB_0011d02f:
      *(char *)puVar25 = cVar10;
      puVar25 = (uint *)((long)puVar25 + 1);
      cVar11 = cVar10;
    }
    cVar10 = *pcVar9;
    *pcVar9 = '\0';
    pcVar9 = pcVar9 + 1;
  } while( true );
}

Assistant:

void ConstPool::fill(void* dst) const noexcept {
  // Clears possible gaps, asmjit should never emit garbage to the output.
  memset(dst, 0, _size);

  ConstPoolFill filler(static_cast<uint8_t*>(dst), 1);
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].forEach(filler);
    filler._dataSize <<= 1;
  }
}